

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_image.cpp
# Opt level: O0

void Png_Operation::Save(string *path,Image *image,uint32_t startX,uint32_t startY,uint32_t width,
                        uint32_t height)

{
  uchar uVar1;
  uint8_t uVar2;
  byte bVar3;
  uint32_t uVar4;
  char *__filename;
  undefined8 uVar5;
  void *__ptr;
  size_t __size;
  void *pvVar6;
  int in_ECX;
  uchar *puVar7;
  int in_EDX;
  ImageTemplate<unsigned_char> *in_RSI;
  uint in_R8D;
  uint in_R9D;
  uint32_t y_2;
  uint32_t x_1;
  uint32_t x;
  uint8_t *outX;
  uint8_t *column;
  uint32_t y_1;
  uint8_t *outY;
  bool grayScaleImage;
  uint32_t y;
  size_t rowByteCount;
  uint8_t **row_pointers;
  png_infop info;
  png_structp png;
  FILE *file;
  uint32_t in_stack_ffffffffffffff30;
  uint32_t in_stack_ffffffffffffff34;
  uint32_t in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff3c;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  imageException *in_stack_ffffffffffffff50;
  uint local_8c;
  uint local_88;
  uint local_84;
  uchar *local_80;
  uchar *local_78;
  uint local_6c;
  uchar *local_68;
  uint local_5c;
  long local_48;
  long local_40 [3];
  FILE *local_28;
  uint local_20;
  uint local_1c;
  int local_18;
  int local_14;
  ImageTemplate<unsigned_char> *local_10;
  
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff34,in_stack_ffffffffffffff30);
  __filename = (char *)std::__cxx11::string::data();
  local_28 = fopen(__filename,"wb");
  if (local_28 == (FILE *)0x0) {
    uVar5 = __cxa_allocate_exception(0x28);
    imageException::imageException
              (in_stack_ffffffffffffff50,
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    __cxa_throw(uVar5,&imageException::typeinfo,imageException::~imageException);
  }
  local_40[0] = png_create_write_struct("1.6.37",0,0);
  if (local_40[0] != 0) {
    local_48 = png_create_info_struct(local_40[0]);
    if (local_48 != 0) {
      png_init_io(local_40[0],local_28);
      png_set_IHDR(local_40[0],local_48,local_1c,local_20,8,6,0,0,0);
      png_write_info(local_40[0],local_48);
      __ptr = malloc((ulong)local_20 << 3);
      __size = png_get_rowbytes(local_40[0],local_48);
      for (local_5c = 0; local_5c < local_20; local_5c = local_5c + 1) {
        pvVar6 = malloc(__size);
        *(void **)((long)__ptr + (ulong)local_5c * 8) = pvVar6;
      }
      uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(local_10);
      local_68 = PenguinV_Image::ImageTemplate<unsigned_char>::data(local_10);
      uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(local_10);
      local_68 = local_68 + local_18 * uVar4;
      bVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(local_10);
      local_68 = local_68 + local_14 * (uint)bVar3;
      local_6c = 0;
      while (local_6c < local_20) {
        local_78 = *(uchar **)((long)__ptr + (ulong)local_6c * 8);
        local_80 = local_68;
        if (uVar2 == '\x01') {
          for (local_84 = 0; local_84 < local_1c; local_84 = local_84 + 1) {
            uVar1 = *local_80;
            local_78[2] = uVar1;
            local_78[1] = uVar1;
            *local_78 = uVar1;
            local_78[3] = 0xff;
            local_78 = local_78 + 4;
            local_80 = local_80 + 1;
          }
        }
        else {
          for (local_88 = 0; local_88 < local_1c; local_88 = local_88 + 1) {
            local_78[2] = *local_80;
            puVar7 = local_80 + 2;
            local_78[1] = local_80[1];
            local_80 = local_80 + 3;
            *local_78 = *puVar7;
            local_78[3] = 0xff;
            local_78 = local_78 + 4;
          }
        }
        local_6c = local_6c + 1;
        uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(local_10);
        local_68 = local_68 + uVar4;
      }
      png_write_image(local_40[0],__ptr);
      png_write_end(local_40[0],0);
      fclose(local_28);
      for (local_8c = 0; local_8c < local_20; local_8c = local_8c + 1) {
        free(*(void **)((long)__ptr + (ulong)local_8c * 8));
      }
      free(__ptr);
      png_destroy_write_struct(local_40,&local_48);
      return;
    }
    uVar5 = __cxa_allocate_exception(0x28);
    imageException::imageException
              (in_stack_ffffffffffffff50,
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    __cxa_throw(uVar5,&imageException::typeinfo,imageException::~imageException);
  }
  uVar5 = __cxa_allocate_exception(0x28);
  imageException::imageException
            (in_stack_ffffffffffffff50,
             (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  __cxa_throw(uVar5,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void Save( const std::string & path, const PenguinV_Image::Image & image, uint32_t startX, uint32_t startY,
               uint32_t width, uint32_t height )
    {
        Image_Function::ParameterValidation( image, startX, startY, width, height );

        FILE * file = fopen( path.data(), "wb" );
        if( !file )
            throw imageException( "Cannot create file for saving" );

        png_structp png = png_create_write_struct( PNG_LIBPNG_VER_STRING, NULL, NULL, NULL );
        if( !png )
            throw imageException( "Cannot create file for saving" );

        png_infop info = png_create_info_struct( png );
        if( !info )
            throw imageException( "Cannot create file for saving" );

        png_init_io( png, file );

        // Output is 8bit depth, RGBA format
        png_set_IHDR( png, info, width, height, 8, PNG_COLOR_TYPE_RGBA, PNG_INTERLACE_NONE,
                      PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT );

        png_write_info( png, info );

        uint8_t ** row_pointers = reinterpret_cast<uint8_t**>( malloc( sizeof( uint8_t* ) * height ) );

        const size_t rowByteCount = png_get_rowbytes( png, info );

        for( uint32_t y = 0; y < height; ++y )
            row_pointers[y] = reinterpret_cast<uint8_t*>( malloc( rowByteCount ) );

        const bool grayScaleImage = image.colorCount() == PenguinV_Image::GRAY_SCALE;

        const uint8_t * outY = image.data() + startY * image.rowSize() + startX * image.colorCount();
        for( uint32_t y = 0; y < height; ++y, outY += image.rowSize() ) {
            uint8_t * column = row_pointers[y];
            const uint8_t * outX = outY;

            if( grayScaleImage )
            {
                for( uint32_t x = 0; x < width; ++x, column += 4 ) {
                    column[0] = column[1] = column[2] = *(outX++);
                    column[3] = 255;
                }
            }
            else
            {
                for( uint32_t x = 0; x < width; ++x, column += 4 ) {
                    column[2] = *(outX++);
                    column[1] = *(outX++);
                    column[0] = *(outX++);
                    column[3] = 255;
                }
            }
        }

        png_write_image( png, row_pointers );
        png_write_end( png, NULL );

        fclose( file );

        for( uint32_t y = 0; y < height; ++y )
            free( row_pointers[y] );
        free( row_pointers );

        png_destroy_write_struct( &png, &info );
    }